

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProps.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  int iVar5;
  char *pcVar6;
  SimInfo *info_00;
  undefined8 this;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  SimInfo *info;
  int order;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f8 [20];
  int privilegedAxis;
  string sele2;
  string sele1;
  string dumpFileName;
  RealType maxLen;
  SimCreator creator;
  gengetopt_args_info args_info;
  
  iVar5 = cmdline_parser(argc,argv,&args_info);
  if (iVar5 != 0) {
    cmdline_parser_print_help();
    exit(1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dumpFileName,args_info.input_arg,(allocator<char> *)&creator);
  paVar1 = &sele1.field_2;
  sele1._M_string_length = 0;
  sele1.field_2._M_local_buf[0] = '\0';
  paVar2 = &sele2.field_2;
  sele2._M_string_length = 0;
  sele2.field_2._M_local_buf[0] = '\0';
  sele2._M_dataplus._M_p = (pointer)paVar2;
  sele1._M_dataplus._M_p = (pointer)paVar1;
  if (args_info.sele1_given == 0) {
    pcVar6 = getenv("SELECTION1");
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "select all";
    }
    else {
      strlen(pcVar6);
    }
    std::__cxx11::string::_M_replace((ulong)&sele1,0,(char *)0x0,(ulong)pcVar6);
  }
  else {
    strlen(args_info.sele1_arg);
    std::__cxx11::string::_M_replace((ulong)&sele1,0,(char *)0x0,(ulong)args_info.sele1_arg);
  }
  sVar4 = sele2._M_string_length;
  if (args_info.sele2_given == 0) {
    pcVar6 = getenv("SELECTION2");
    sVar4 = sele2._M_string_length;
    if (pcVar6 == (char *)0x0) {
      std::__cxx11::string::_M_assign((string *)&sele2);
    }
    else {
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&sele2,0,(char *)sVar4,(ulong)pcVar6);
    }
  }
  else {
    strlen(args_info.sele2_arg);
    std::__cxx11::string::_M_replace((ulong)&sele2,0,(char *)sVar4,(ulong)args_info.sele2_arg);
  }
  if (args_info.privilegedAxis_arg == privilegedAxis_arg_y) {
    privilegedAxis = 1;
  }
  else if (args_info.privilegedAxis_arg == privilegedAxis_arg_x) {
    privilegedAxis = 0;
  }
  else {
    privilegedAxis = 2;
  }
  paVar3 = &creator.mdFileName_.field_2;
  creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002f7ea0;
  creator.mdFileName_._M_string_length = 0;
  creator.mdFileName_.field_2._M_local_buf[0] = '\0';
  creator.mdFileName_._M_dataplus._M_p = (pointer)paVar3;
  info_00 = OpenMD::SimCreator::createSim(&creator,&dumpFileName,false);
  uVar9 = painCave.errMsg._35_4_;
  if (args_info.length_given == 0) {
    uVar7 = 0;
    uVar8 = 0x40590000;
  }
  else {
    uVar7 = SUB84(args_info.length_arg,0);
    uVar8 = (undefined4)((ulong)args_info.length_arg >> 0x20);
  }
  maxLen = (RealType)CONCAT44(uVar8,uVar7);
  info = info_00;
  if (args_info.sdcorr_given == 0) {
    if (args_info.selecorr_given == 0) {
      if (args_info.dcorr_given == 0) {
        if (args_info.rcorr_given == 0) {
          if (args_info.r_rcorr_given == 0) {
            if (args_info.thetacorr_given == 0) {
              if (args_info.drcorr_given == 0) {
                if (args_info.rcorrZ_given == 0) {
                  if (args_info.vcorr_given == 0) {
                    if (args_info.vcorrZ_given == 0) {
                      if (args_info.vcorrR_given == 0) {
                        if (args_info.wcorr_given == 0) {
                          if (args_info.pjcorr_given == 0) {
                            if (args_info.ftcorr_given == 0) {
                              if (args_info.ckcorr_given == 0) {
                                if (args_info.cscorr_given == 0) {
                                  if (args_info.facorr_given == 0) {
                                    if (args_info.tfcorr_given == 0) {
                                      if (args_info.tacorr_given == 0) {
                                        if (args_info.bondcorr_given == 0) {
                                          if (args_info.stresscorr_given == 0) {
                                            if (args_info.freqfluccorr_given == 0) {
                                              if (args_info.lcorr_given == 0) {
                                                if (args_info.lcorrZ_given == 0) {
                                                  if (args_info.cohZ_given == 0) {
                                                    if (args_info.jumptime_given == 0) {
                                                      if (args_info.jumptimeZ_given == 0) {
                                                        if (args_info.jumptimeR_given == 0) {
                                                          if (args_info.persistence_given != 0) {
                                                            std::
                                                  make_unique<OpenMD::HBondPersistence,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(double *)&sele2,
                                                  &args_info.OOcut_arg,&args_info.thetacut_arg);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  if (args_info.disp_given != 0) {
                                                    std::
                                                  make_unique<OpenMD::Displacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  if (args_info.dispZ_given != 0) {
                                                    std::
                                                  make_unique<OpenMD::DisplacementZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(int *)&sele2,
                                                  &args_info.nzbins_arg);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  if (args_info.current_given != 0) {
                                                    std::
                                                  make_unique<OpenMD::CurrentDensityAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  if (args_info.onsager_given == 0) {
                                                    if (args_info.ddisp_given == 0) {
                                                      if (args_info.vaOutProdcorr_given == 0) {
                                                        if (args_info.waOutProdcorr_given == 0) {
                                                          if (args_info.vwOutProdcorr_given == 0) {
                                                            if (args_info.wvOutProdcorr_given == 0)
                                                            {
                                                              if (args_info.rotAngleDisp_given == 0)
                                                              {
                                                                if (args_info.meandisp_given == 0) {
                                                                  this = (SelectionCorrFunc *)0x0;
                                                                }
                                                                else {
                                                                  std::
                                                  make_unique<OpenMD::MeanDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::RotAngleDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::AngularVelVelOutProdCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::VelAngularVelOutProdCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::AngularVelocityAutoOutProductCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::VelocityAutoOutProductCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::CollectiveDipoleDisplacement,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  goto LAB_001356dc;
                                                  }
                                                  if (args_info.sele1_given != 0) {
                                                    std::
                                                  make_unique<OpenMD::OnsagerCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  builtin_strncpy(painCave.errMsg + 0x23,
                                                                  "ass Rcorr\n",0xb);
                                                  painCave.errMsg[0x10] = 's';
                                                  painCave.errMsg[0x11] = 'e';
                                                  painCave.errMsg[0x12] = 't';
                                                  painCave.errMsg[0x13] = ' ';
                                                  painCave.errMsg[0x14] = 'f';
                                                  painCave.errMsg[0x15] = 'o';
                                                  painCave.errMsg[0x16] = 'r';
                                                  painCave.errMsg[0x17] = ' ';
                                                  builtin_strncpy(painCave.errMsg + 0x18,
                                                                  "Center of M",0xb);
                                                  uVar9._0_1_ = 'l';
                                                  uVar9._1_1_ = 'e';
                                                  uVar9._2_1_ = '1';
                                                  uVar9._3_1_ = ' ';
                                                  }
                                                  else {
                                                    if (args_info.sele3_given != 0) {
                                                      std::
                                                  make_unique<OpenMD::HBondJumpR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,char*&,double&,double&,double&,double&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(char **)&sele2,
                                                  (double *)&args_info.sele3_arg,
                                                  &args_info.OOcut_arg,&args_info.thetacut_arg,
                                                  &args_info.OHcut_arg,(int *)&maxLen);
                                                  this = local_508._M_allocated_capacity;
                                                  goto LAB_001356dc;
                                                  }
                                                  builtin_strncpy(painCave.errMsg + 0x23,"is set\n",
                                                                  8);
                                                  builtin_strncpy(painCave.errMsg + 0x10,
                                                                  "set if --jumptimeR ",0x13);
                                                  uVar9._0_1_ = 'l';
                                                  uVar9._1_1_ = 'e';
                                                  uVar9._2_1_ = '3';
                                                  uVar9._3_1_ = ' ';
                                                  }
                                                  painCave.errMsg[4] = (char)uVar9;
                                                  painCave.errMsg[5] = SUB41(uVar9,1);
                                                  painCave.errMsg[6] = SUB41(uVar9,2);
                                                  painCave.errMsg[7] = SUB41(uVar9,3);
                                                  builtin_strncpy(painCave.errMsg,"--se",4);
                                                  builtin_strncpy(painCave.errMsg + 8,"must be ",8);
                                                  painCave.isFatal = 1;
                                                  painCave.severity = 1;
                                                  simError();
                                                  this = (SelectionCorrFunc *)0x0;
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::HBondJumpZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,int&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(double *)&sele2,
                                                  &args_info.OOcut_arg,&args_info.thetacut_arg,
                                                  (int *)&args_info.OHcut_arg,&args_info.nzbins_arg)
                                                  ;
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    std::
                                                  make_unique<OpenMD::HBondJump,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(double *)&sele2,
                                                  &args_info.OOcut_arg,&args_info.thetacut_arg);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                  }
                                                  else {
                                                    order = 0;
                                                    if (args_info.order_given == 0) {
                                                      builtin_strncpy(painCave.errMsg,
                                                                                                                                            
                                                  "--order must be set if --cohZ is set\n",0x26);
                                                  painCave.errMsg[0x26] = SUB41(uVar9,3);
                                                  painCave.isFatal = 1;
                                                  painCave.severity = 1;
                                                  simError();
                                                  }
                                                  else {
                                                    order = args_info.order_arg;
                                                  }
                                                  std::
                                                  make_unique<OpenMD::COHZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(int *)&sele2,&order,
                                                  &args_info.nzbins_arg);
                                                  this = local_508._M_allocated_capacity;
                                                  }
                                                }
                                                else {
                                                  order = 0;
                                                  if (args_info.order_given == 0) {
                                                    builtin_strncpy(painCave.errMsg,
                                                                                                                                        
                                                  "--order must be set if --lcorrZ is set\n",0x27);
                                                  painCave.errMsg._39_4_ =
                                                       painCave.errMsg._39_4_ & 0xffffff00;
                                                  painCave.isFatal = 1;
                                                  painCave.severity = 1;
                                                  simError();
                                                  }
                                                  else {
                                                    order = args_info.order_arg;
                                                  }
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(int *)&sele2,&order,
                                                  &args_info.nzbins_arg);
                                                  this = local_508._M_allocated_capacity;
                                                }
                                              }
                                              else {
                                                order = 0;
                                                if (args_info.order_given == 0) {
                                                  builtin_strncpy(painCave.errMsg,
                                                                                                                                    
                                                  "--order must be set if --lcorr is set\n",0x27);
                                                  painCave.isFatal = 1;
                                                  painCave.severity = 1;
                                                  simError();
                                                }
                                                else {
                                                  order = args_info.order_arg;
                                                }
                                                if (args_info.seleoffset_given == 0) {
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(int *)&sele2);
                                                  this = local_508._M_allocated_capacity;
                                                }
                                                else {
                                                  std::
                                                  make_unique<OpenMD::LegendreCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                                                            ((SimInfo **)
                                                             &local_508._M_allocated_capacity,
                                                             (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1,(int *)&sele2,
                                                  &args_info.seleoffset_arg);
                                                  this = local_508._M_allocated_capacity;
                                                }
                                              }
                                            }
                                            else {
                                              std::
                                              make_unique<OpenMD::FreqFlucCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                        ((SimInfo **)
                                                         &local_508._M_allocated_capacity,
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                              this = local_508._M_allocated_capacity;
                                            }
                                          }
                                          else {
                                            std::
                                            make_unique<OpenMD::StressCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                      ((SimInfo **)&local_508._M_allocated_capacity,
                                                       (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                            this = local_508._M_allocated_capacity;
                                          }
                                        }
                                        else {
                                          std::
                                          make_unique<OpenMD::BondCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                    ((SimInfo **)&local_508._M_allocated_capacity,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                          this = local_508._M_allocated_capacity;
                                        }
                                      }
                                      else {
                                        std::
                                        make_unique<OpenMD::TorqueAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                  ((SimInfo **)&local_508._M_allocated_capacity,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                        this = local_508._M_allocated_capacity;
                                      }
                                    }
                                    else {
                                      std::
                                      make_unique<OpenMD::TorForCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                                ((SimInfo **)&local_508._M_allocated_capacity,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&info,&dumpFileName,&sele1);
                                      this = local_508._M_allocated_capacity;
                                    }
                                  }
                                  else {
                                    std::
                                    make_unique<OpenMD::ForceAutoCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                              ((SimInfo **)&local_508._M_allocated_capacity,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&info,&dumpFileName,&sele1);
                                    this = local_508._M_allocated_capacity;
                                  }
                                }
                                else {
                                  this = (SelectionCorrFunc *)0x0;
                                  if (((args_info.dipoleX_given != 0) &&
                                      (args_info.dipoleY_given != 0)) &&
                                     (args_info.dipoleZ_given != 0)) {
                                    std::
                                    make_unique<OpenMD::ChargeOrientationCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,double&>
                                              ((SimInfo **)&local_508._M_allocated_capacity,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&info,&dumpFileName,&sele1,(double *)&sele2,
                                               &args_info.dipoleX_arg,&args_info.dipoleY_arg,
                                               &args_info.dipoleZ_arg);
                                    this = local_508._M_allocated_capacity;
                                  }
                                }
                              }
                              else {
                                std::
                                make_unique<OpenMD::ChargeKineticCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&>
                                          ((SimInfo **)&local_508._M_allocated_capacity,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&info,&dumpFileName,&sele1,(double *)&sele2);
                                this = local_508._M_allocated_capacity;
                              }
                            }
                            else {
                              std::
                              make_unique<OpenMD::ForTorCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                        ((SimInfo **)&local_508._M_allocated_capacity,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&info,&dumpFileName,&sele1);
                              this = local_508._M_allocated_capacity;
                            }
                          }
                          else {
                            std::
                            make_unique<OpenMD::MomAngMomCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                      ((SimInfo **)&local_508._M_allocated_capacity,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&info,&dumpFileName,&sele1);
                            this = local_508._M_allocated_capacity;
                          }
                        }
                        else {
                          std::
                          make_unique<OpenMD::WCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                    ((SimInfo **)&local_508._M_allocated_capacity,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&info,&dumpFileName,&sele1);
                          this = local_508._M_allocated_capacity;
                        }
                      }
                      else {
                        std::
                        make_unique<OpenMD::VCorrFuncR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                  ((SimInfo **)&local_508._M_allocated_capacity,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&info,&dumpFileName,&sele1);
                        this = local_508._M_allocated_capacity;
                      }
                    }
                    else {
                      std::
                      make_unique<OpenMD::VCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                                ((SimInfo **)&local_508._M_allocated_capacity,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&info,&dumpFileName,&sele1);
                      this = local_508._M_allocated_capacity;
                    }
                  }
                  else {
                    std::
                    make_unique<OpenMD::VCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                              ((SimInfo **)&local_508._M_allocated_capacity,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &info,&dumpFileName,&sele1);
                    this = local_508._M_allocated_capacity;
                  }
                }
                else {
                  std::
                  make_unique<OpenMD::RCorrFuncZ,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,int&,int&>
                            ((SimInfo **)&local_508._M_allocated_capacity,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &info,&dumpFileName,&sele1,(int *)&sele2,&args_info.nzbins_arg);
                  this = local_508._M_allocated_capacity;
                }
              }
              else {
                std::
                make_unique<OpenMD::DirectionalRCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                          ((SimInfo **)&local_508._M_allocated_capacity,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &info,&dumpFileName,&sele1);
                this = local_508._M_allocated_capacity;
              }
            }
            else {
              std::
              make_unique<OpenMD::ThetaCorrFunc,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                        ((SimInfo **)&local_508._M_allocated_capacity,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                         &dumpFileName,&sele1);
              this = local_508._M_allocated_capacity;
            }
          }
          else {
            std::
            make_unique<OpenMD::RCorrFuncR,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                      ((SimInfo **)&local_508._M_allocated_capacity,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                       &dumpFileName,&sele1);
            this = local_508._M_allocated_capacity;
          }
        }
        else {
          this = operator_new(0xe58);
          OpenMD::RCorrFunc::RCorrFunc((RCorrFunc *)this,info_00,&dumpFileName,&sele1,&sele2);
        }
      }
      else {
        this = operator_new(0xe58);
        OpenMD::DipoleCorrFunc::DipoleCorrFunc
                  ((DipoleCorrFunc *)this,info_00,&dumpFileName,&sele1,&sele2);
      }
    }
    else {
      this = operator_new(0xe70);
      OpenMD::SelectionCorrFunc::SelectionCorrFunc
                ((SelectionCorrFunc *)this,info_00,&dumpFileName,&sele1,&sele2);
    }
  }
  else {
    this = operator_new(0xe60);
    OpenMD::SystemDipoleCorrFunc::SystemDipoleCorrFunc
              ((SystemDipoleCorrFunc *)this,info_00,&dumpFileName,&sele1,&sele2);
  }
LAB_001356dc:
  if (args_info.selectionMode_arg == selectionMode_arg_restart) {
    (((SystemACF<double> *)&((SelectionCorrFunc *)this)->super_ObjectCCF<int>)->
    super_AutoCorrFunc<double>).super_TimeCorrFunc<double>.super_DynamicProperty.
    selectionModeRestart_ = true;
  }
  if (args_info.output_given != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_508._M_local_buf,args_info.output_arg,(allocator<char> *)&order);
    std::__cxx11::string::_M_assign
              ((string *)
               &(((SystemACF<double> *)&((SelectionCorrFunc *)this)->super_ObjectCCF<int>)->
                super_AutoCorrFunc<double>).super_TimeCorrFunc<double>.super_DynamicProperty.
                outputFilename_);
    if ((SelectionCorrFunc *)local_508._M_allocated_capacity != (SelectionCorrFunc *)local_4f8) {
      operator_delete((void *)local_508._M_allocated_capacity,local_4f8._0_8_ + 1);
    }
  }
  (*(((SystemACF<double> *)&((SelectionCorrFunc *)this)->super_ObjectCCF<int>)->
    super_AutoCorrFunc<double>).super_TimeCorrFunc<double>.super_DynamicProperty.
    _vptr_DynamicProperty[2])(this);
  if (info != (SimInfo *)0x0) {
    (*info->_vptr_SimInfo[1])();
  }
  (*(((SystemACF<double> *)&((SelectionCorrFunc *)this)->super_ObjectCCF<int>)->
    super_AutoCorrFunc<double>).super_TimeCorrFunc<double>.super_DynamicProperty.
    _vptr_DynamicProperty[1])(this);
  creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002f7ea0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)creator.mdFileName_._M_dataplus._M_p != paVar3) {
    operator_delete(creator.mdFileName_._M_dataplus._M_p,
                    CONCAT71(creator.mdFileName_.field_2._M_allocated_capacity._1_7_,
                             creator.mdFileName_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sele2._M_dataplus._M_p != paVar2) {
    operator_delete(sele2._M_dataplus._M_p,
                    CONCAT71(sele2.field_2._M_allocated_capacity._1_7_,sele2.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sele1._M_dataplus._M_p != paVar1) {
    operator_delete(sele1._M_dataplus._M_p,
                    CONCAT71(sele1.field_2._M_allocated_capacity._1_7_,sele1.field_2._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dumpFileName._M_dataplus._M_p != &dumpFileName.field_2) {
    operator_delete(dumpFileName._M_dataplus._M_p,dumpFileName.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  struct gengetopt_args_info args_info;

  // parse the command line option

  if (cmdline_parser(argc, argv, &args_info) != 0) {
    cmdline_parser_print_help();
    exit(1);
  }

  // get the dumpfile name and meta-data file name
  std::string dumpFileName = args_info.input_arg;

  std::string sele1;
  std::string sele2;

  // check the first selection argument, or set it to the environment
  // variable, or failing that, set it to "select all"

  if (args_info.sele1_given) {
    sele1 = args_info.sele1_arg;
  } else {
    char* sele1Env = getenv("SELECTION1");
    if (sele1Env) {
      sele1 = sele1Env;
    } else {
      sele1 = "select all";
    }
  }

  // check the second selection argument, or set it to the environment
  // variable, or failing that, set it to the first selection

  if (args_info.sele2_given) {
    sele2 = args_info.sele2_arg;
  } else {
    char* sele2Env = getenv("SELECTION2");
    if (sele2Env) {
      sele2 = sele2Env;
    } else {
      // If sele2 is not specified, then the default behavior
      // should be what is already intended for sele1
      sele2 = sele1;
    }
  }

  // convert privilegedAxis to corresponding integer
  // x axis -> 0
  // y axis -> 1
  // z axis -> 2 (default)

  int privilegedAxis;
  switch (args_info.privilegedAxis_arg) {
  case privilegedAxis_arg_x:
    privilegedAxis = 0;
    break;
  case privilegedAxis_arg_y:
    privilegedAxis = 1;
    break;
  case privilegedAxis_arg_z:
  default:
    privilegedAxis = 2;
    break;
  }

  // use the memory string to figure out how much memory we can use:
  // char *end;
  // long long int memSize = memparse(args_info.memory_arg, &end);

  // We don't really need to print this out anymore:
  // snprintf( painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
  //           "Amount of memory being used: %llu bytes\n", memSize);
  // painCave.severity = OPENMD_INFO;
  // painCave.isFatal = 0;
  // simError();

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(dumpFileName, false);

  RealType maxLen;
  if (args_info.length_given) {
    maxLen = args_info.length_arg;
  } else {
    maxLen = 100.0;
  }

  std::unique_ptr<DynamicProperty> corrFunc {nullptr};

  if (args_info.sdcorr_given) {
    corrFunc = std::make_unique<SystemDipoleCorrFunc>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.selecorr_given) {
    corrFunc =
        std::make_unique<SelectionCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.dcorr_given) {
    corrFunc =
        std::make_unique<DipoleCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.rcorr_given) {
    corrFunc = std::make_unique<RCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.r_rcorr_given) {
    corrFunc = std::make_unique<RCorrFuncR>(info, dumpFileName, sele1, sele2);
  } else if (args_info.thetacorr_given) {
    corrFunc =
        std::make_unique<ThetaCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.drcorr_given) {
    corrFunc = std::make_unique<DirectionalRCorrFunc>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.rcorrZ_given) {
    corrFunc = std::make_unique<RCorrFuncZ>(
        info, dumpFileName, sele1, sele2, args_info.nzbins_arg, privilegedAxis);
  } else if (args_info.vcorr_given) {
    corrFunc = std::make_unique<VCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.vcorrZ_given) {
    corrFunc = std::make_unique<VCorrFuncZ>(info, dumpFileName, sele1, sele2);
  } else if (args_info.vcorrR_given) {
    corrFunc = std::make_unique<VCorrFuncR>(info, dumpFileName, sele1, sele2);
  } else if (args_info.wcorr_given) {
    corrFunc = std::make_unique<WCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.pjcorr_given) {
    corrFunc =
        std::make_unique<MomAngMomCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.ftcorr_given) {
    corrFunc =
        std::make_unique<ForTorCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.ckcorr_given) {
    corrFunc = std::make_unique<ChargeKineticCorrFunc>(
        info, dumpFileName, sele1, sele2, args_info.rcut_arg);
  } else if (args_info.cscorr_given) {
    if (args_info.dipoleX_given && args_info.dipoleY_given &&
        args_info.dipoleZ_given) {
      corrFunc = std::make_unique<ChargeOrientationCorrFunc>(
          info, dumpFileName, sele1, sele2, args_info.dipoleX_arg,
          args_info.dipoleY_arg, args_info.dipoleZ_arg, args_info.rcut_arg);
    }
  } else if (args_info.facorr_given) {
    corrFunc =
        std::make_unique<ForceAutoCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.tfcorr_given) {
    corrFunc =
        std::make_unique<TorForCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.tacorr_given) {
    corrFunc =
        std::make_unique<TorqueAutoCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.bondcorr_given) {
    corrFunc = std::make_unique<BondCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.stresscorr_given) {
    corrFunc =
        std::make_unique<StressCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.freqfluccorr_given) {
    corrFunc =
        std::make_unique<FreqFlucCorrFunc>(info, dumpFileName, sele1, sele2);
  } else if (args_info.lcorr_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --lcorr is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    if (args_info.seleoffset_given) {
      corrFunc = std::make_unique<LegendreCorrFunc>(info, dumpFileName, sele1,
						    sele2,
						    args_info.seleoffset_arg,
						    order);
    } else {
    
      corrFunc = std::make_unique<LegendreCorrFunc>(info, dumpFileName, sele1,
						    sele2, order);
    }
  } else if (args_info.lcorrZ_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --lcorrZ is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    corrFunc = std::make_unique<LegendreCorrFuncZ>(
        info, dumpFileName, sele1, sele2, order, args_info.nzbins_arg,
        privilegedAxis);

  } else if (args_info.cohZ_given) {
    int order(0);
    if (args_info.order_given)
      order = args_info.order_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--order must be set if --cohZ is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    corrFunc = std::make_unique<COHZ>(info, dumpFileName, sele1, sele2, order,
                                      args_info.nzbins_arg, privilegedAxis);

  } else if (args_info.jumptime_given) {
    corrFunc = std::make_unique<HBondJump>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg);
  } else if (args_info.jumptimeZ_given) {
    corrFunc = std::make_unique<HBondJumpZ>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg, args_info.nzbins_arg,
        privilegedAxis);
  } else if (args_info.jumptimeR_given) {
    if (args_info.sele3_given) {
      corrFunc = std::make_unique<HBondJumpR>(
          info, dumpFileName, sele1, sele2, args_info.sele3_arg,
          args_info.OOcut_arg, args_info.thetacut_arg, args_info.OHcut_arg,
          maxLen, args_info.nbins_arg);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele3 must be set if --jumptimeR is set\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.persistence_given) {
    corrFunc = std::make_unique<HBondPersistence>(
        info, dumpFileName, sele1, sele2, args_info.OOcut_arg,
        args_info.thetacut_arg, args_info.OHcut_arg);
  } else if (args_info.disp_given) {
    corrFunc = std::make_unique<Displacement>(info, dumpFileName, sele1, sele2);
  } else if (args_info.dispZ_given) {
    corrFunc = std::make_unique<DisplacementZ>(
        info, dumpFileName, sele1, sele2, args_info.nzbins_arg, privilegedAxis);
  } else if (args_info.current_given) {
    corrFunc = std::make_unique<CurrentDensityAutoCorrFunc>(info, dumpFileName,
                                                            sele1, sele2);
  } else if (args_info.onsager_given) {
    if (args_info.sele1_given) {
      corrFunc =
          std::make_unique<OnsagerCorrFunc>(info, dumpFileName, sele1, sele2);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--sele1 must be set for Center of Mass Rcorr\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.ddisp_given) {
    corrFunc = std::make_unique<CollectiveDipoleDisplacement>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.vaOutProdcorr_given) {
    corrFunc = std::make_unique<VelocityAutoOutProductCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.waOutProdcorr_given) {
    corrFunc = std::make_unique<AngularVelocityAutoOutProductCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.vwOutProdcorr_given) {
    corrFunc = std::make_unique<VelAngularVelOutProdCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.wvOutProdcorr_given) {
    corrFunc = std::make_unique<AngularVelVelOutProdCorrFunc>(
        info, dumpFileName, sele1, sele2);
  } else if (args_info.rotAngleDisp_given) {
    corrFunc = std::make_unique<RotAngleDisplacement>(info, dumpFileName, sele1,
                                                      sele2);
  } else if (args_info.meandisp_given) {
    corrFunc =
        std::make_unique<MeanDisplacement>(info, dumpFileName, sele1, sele2);
  }

  if (args_info.selectionMode_arg == selectionMode_arg_restart) {
    corrFunc->setSelectionModeRestart();
  }
  if (args_info.output_given) { corrFunc->setOutputName(args_info.output_arg); }

  corrFunc->doCorrelate();

  delete info;
  return 0;
}